

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYReader::printHeader(PLYReader *this)

{
  undefined4 uVar1;
  ulong uVar2;
  int iVar3;
  size_type sVar4;
  reference ppPVar5;
  ostream *poVar6;
  long lVar7;
  long in_RDI;
  int k;
  PLYElement *element;
  size_t i;
  PLYProperty *in_stack_000000a8;
  PLYElement *in_stack_00000118;
  int in_stack_ffffffffffffff5c;
  PLYElement *in_stack_ffffffffffffff60;
  undefined1 local_68 [80];
  value_type local_18;
  ulong local_10;
  
  for (local_10 = 0; uVar2 = local_10,
      sVar4 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 0x228)), uVar2 < sVar4; local_10 = local_10 + 1) {
    ppPVar5 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 0x228),local_10);
    local_18 = *ppPVar5;
    PLYElement::toString_abi_cxx11_(in_stack_00000118);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)(local_68 + 0x30));
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)(local_68 + 0x30));
    lVar7 = PLYElement::getInstances(local_18);
    if (0 < lVar7) {
      for (local_68._32_4_ = 0; uVar1 = local_68._32_4_,
          iVar3 = PLYElement::getPropertyCount((PLYElement *)0x14537b), (int)uVar1 < iVar3;
          local_68._32_4_ = local_68._32_4_ + 1) {
        PLYElement::getProperty(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff60 = (PLYElement *)local_68;
        (anonymous_namespace)::PLYProperty::toString_abi_cxx11_(in_stack_000000a8);
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)in_stack_ffffffffffffff60);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  return;
}

Assistant:

void PLYReader::printHeader()
{
  for (size_t i=0; i<list.size(); i++)
  {
    PLYElement *element=list[i];

    std::cout << element->toString() << std::endl;

    if (element->getInstances() > 0)
    {
      // write properties

      for (int k=0; k<element->getPropertyCount(); k++)
      {
        std::cout << element->getProperty(k).toString() << std::endl;
      }
    }
  }
}